

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Fts5UnicodeIsdiacritic(int c)

{
  undefined4 local_14;
  uint mask1;
  uint mask0;
  int c_local;
  undefined4 local_4;
  
  if ((c < 0x300) || (0x331 < c)) {
    local_4 = 0;
  }
  else {
    if (c < 800) {
      local_14 = 1 << ((byte)c & 0x1f) & 0x8029fdf;
    }
    else {
      local_14 = 1 << ((byte)c - 0x20 & 0x1f) & 0x361f8;
    }
    local_4 = local_14;
  }
  return local_4;
}

Assistant:

static int sqlite3Fts5UnicodeIsdiacritic(int c){
  unsigned int mask0 = 0x08029FDF;
  unsigned int mask1 = 0x000361F8;
  if( c<768 || c>817 ) return 0;
  return (c < 768+32) ?
      (mask0 & ((unsigned int)1 << (c-768))) :
      (mask1 & ((unsigned int)1 << (c-768-32)));
}